

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

message_t * __thiscall
zmq::encode<std::vector<zmq::mutable_buffer,std::allocator<zmq::mutable_buffer>>,void>
          (message_t *__return_storage_ptr__,zmq *this,
          vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *parts)

{
  ulong uVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  undefined1 *puVar5;
  void *pvVar6;
  range_error *this_00;
  undefined1 uVar7;
  mutable_buffer *part;
  undefined8 *puVar8;
  size_t size_;
  
  size_ = 0;
  for (lVar4 = *(long *)this; lVar4 != *(long *)(this + 8); lVar4 = lVar4 + 0x10) {
    uVar1 = *(ulong *)(lVar4 + 8);
    if (uVar1 >> 0x20 != 0) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"Invalid size, message part too large");
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    size_ = size_ + uVar1 + (ulong)(0xfe < uVar1) * 4 + 1;
  }
  message_t::message_t(__return_storage_ptr__,size_);
  puVar5 = (undefined1 *)message_t::data(__return_storage_ptr__);
  puVar2 = *(undefined8 **)(this + 8);
  for (puVar8 = *(undefined8 **)this; puVar8 != puVar2; puVar8 = puVar8 + 2) {
    pvVar6 = (void *)*puVar8;
    uVar1 = puVar8[1];
    uVar3 = (uint)uVar1;
    if (uVar3 < 0xff) {
      uVar7 = (undefined1)uVar1;
      lVar4 = 1;
    }
    else {
      *(uint *)(puVar5 + 1) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar7 = 0xff;
      lVar4 = 5;
    }
    *puVar5 = uVar7;
    memcpy(puVar5 + lVar4,pvVar6,uVar1 & 0xffffffff);
    puVar5 = puVar5 + lVar4 + (uVar1 & 0xffffffff);
  }
  pvVar6 = message_t::data(__return_storage_ptr__);
  if ((long)puVar5 - (long)pvVar6 == size_) {
    return __return_storage_ptr__;
  }
  __assert_fail("static_cast<size_t>(buf - encoded.data<unsigned char>()) == mmsg_size",
                "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                0x13a,
                "message_t zmq::encode(const Range &) [Range = std::vector<zmq::mutable_buffer>]");
}

Assistant:

message_t encode(const Range &parts)
{
    size_t mmsg_size = 0;

    // First pass check sizes
    for (const auto &part : parts) {
        const size_t part_size = part.size();
        if (part_size > (std::numeric_limits<std::uint32_t>::max)()) {
            // Size value must fit into uint32_t.
            throw std::range_error("Invalid size, message part too large");
        }
        const size_t count_size =
          part_size < (std::numeric_limits<std::uint8_t>::max)() ? 1 : 5;
        mmsg_size += part_size + count_size;
    }

    message_t encoded(mmsg_size);
    unsigned char *buf = encoded.data<unsigned char>();
    for (const auto &part : parts) {
        const uint32_t part_size = static_cast<uint32_t>(part.size());
        const unsigned char *part_data =
          static_cast<const unsigned char *>(part.data());

        if (part_size < (std::numeric_limits<std::uint8_t>::max)()) {
            // small part
            *buf++ = (unsigned char) part_size;
        } else {
            // big part
            *buf++ = (std::numeric_limits<uint8_t>::max)();
            detail::write_network_order(buf, part_size);
            buf += sizeof(part_size);
        }
        std::memcpy(buf, part_data, part_size);
        buf += part_size;
    }

    assert(static_cast<size_t>(buf - encoded.data<unsigned char>()) == mmsg_size);
    return encoded;
}